

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

NULLCRef * NULLCVector::VectorBack(NULLCRef *__return_storage_ptr__,vector *vec)

{
  uint uVar1;
  char *pcVar2;
  
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  if (vec->size == 0) {
    nullcThrowError("vector::back called on an empty vector");
  }
  else {
    uVar1 = vec->elemType;
    if (vec->flags != 0) {
      uVar1 = nullcGetSubType(0);
    }
    __return_storage_ptr__->typeID = uVar1;
    pcVar2 = (vec->data).ptr;
    if (vec->flags == 0) {
      pcVar2 = pcVar2 + (vec->size - 1) * vec->elemSize;
    }
    else {
      pcVar2 = *(char **)(pcVar2 + (ulong)(vec->size - 1) * 8);
    }
    __return_storage_ptr__->ptr = pcVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorBack(vector* vec)
	{
		NULLCRef ret = { 0, 0 };
		if(!vec->size)
		{
			nullcThrowError("vector::back called on an empty vector");
			return ret;
		}
		ret.typeID = (vec->flags ? nullcGetSubType(vec->elemType) : vec->elemType);
		ret.ptr = vec->flags ? ((char**)vec->data.ptr)[vec->size - 1] : (vec->data.ptr + vec->elemSize * (vec->size - 1));
		return ret;
	}